

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsPSetup(void *arkode_mem)

{
  ARKodeMem in_RDI;
  int retval;
  int *jcur;
  int dgamma_fail;
  sunrealtype gamrat;
  sunrealtype gamma;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffc0;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  long local_20;
  ARKodeMem local_18;
  uint local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                       ,in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    local_4 = (*local_18->step_getgammas)
                        (in_RDI,(sunrealtype *)&stack0xffffffffffffffd8,
                         (sunrealtype *)&stack0xffffffffffffffd0,(int **)&stack0xffffffffffffffc0,
                         (int *)&stack0xffffffffffffffcc);
    if (local_4 == 0) {
      local_4 = (**(code **)(local_20 + 0xd0))
                          (*(undefined8 *)(local_20 + 0x78),in_stack_ffffffffffffffd8,
                           *(undefined8 *)(local_20 + 0x60),*(undefined8 *)(local_20 + 0x68),
                           (*(int *)(local_20 + 0x20) != 0 ^ 0xffU) & 1,in_stack_ffffffffffffffc0,
                           *(undefined8 *)(local_20 + 0xe8));
    }
    else {
      arkProcessError(local_18,(int)(ulong)local_4,0x95a,"arkLsPSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"An error occurred in ark_step_getgammas");
    }
  }
  return local_4;
}

Assistant:

int arkLsPSetup(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunrealtype gamma, gamrat;
  sunbooleantype dgamma_fail, *jcur;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get gamma values from time step module */
  retval = ark_mem->step_getgammas(arkode_mem, &gamma, &gamrat, &jcur,
                                   &dgamma_fail);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "An error occurred in ark_step_getgammas");
    return (retval);
  }

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = arkls_mem->pset(arkls_mem->tcur, arkls_mem->ycur, arkls_mem->fcur,
                           !(arkls_mem->jbad), jcur, gamma, arkls_mem->P_data);
  return (retval);
}